

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

bool __thiscall mp::NLSolver::Solve(NLSolver *this,string *solver,string *solver_opts)

{
  ulong uVar1;
  string *__rhs;
  char *__command;
  string *in_RDX;
  string *in_RSI;
  NLSolver *in_RDI;
  int status;
  string call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  int local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  GetFileStub_abi_cxx11_(in_RDI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      __lhs = &local_40;
      std::__cxx11::string::string((string *)__lhs,local_18);
      std::__cxx11::string::operator+=((string *)__lhs,' ');
      __rhs = GetFileStub_abi_cxx11_(in_RDI);
      std::__cxx11::string::operator+=((string *)&local_40,(string *)__rhs);
      std::__cxx11::string::operator+=((string *)&local_40," -AMPL ");
      std::__cxx11::string::operator+=((string *)&local_40,local_20);
      __command = (char *)std::__cxx11::string::c_str();
      local_50 = system(__command);
      if (local_50 == 0) {
        local_1 = 1;
      }
      else {
        std::operator+((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       in_stack_ffffffffffffff30);
        std::operator+(__lhs,(char *)__rhs);
        std::__cxx11::to_string(in_stack_ffffffffffffff3c);
        std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        std::operator+(__lhs,(char *)__rhs);
        std::__cxx11::string::operator=((string *)&in_RDI->err_msg_,local_70);
        local_1 = 0;
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
      }
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      std::__cxx11::string::operator=((string *)&in_RDI->err_msg_,"NLSolver: provide solver.");
      local_1 = 0;
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&in_RDI->err_msg_,"NLSolver: provide filestub.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool NLSolver::Solve(const std::string& solver,
                  const std::string& solver_opts) {
  if (GetFileStub().empty())
    return (err_msg_="NLSolver: provide filestub.", false);
  if (solver.empty())
    return (err_msg_="NLSolver: provide solver.", false);
  auto call = solver;
#ifdef _WIN32
  const std::string ending{".exe"};
  if (solver.length() < ending.length()
      || (0 != solver.compare(solver.length() - ending.length(), ending.length(), ending)))
    call += ending;
#endif  // _WIN32
  call += ' ';
  call += GetFileStub();
  call += " -AMPL ";
  call += solver_opts;
  if (auto status = std::system(call.c_str()))
    return (err_msg_="NLSolver: call \""
        + call + "\" failed (code "
        + std::to_string(status) + ").", false);
  return true;
}